

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.c
# Opt level: O0

void draw_name_hp_bar(char *str,int val_cur,int val_max)

{
  int nh_color;
  attr_t aVar1;
  size_t sVar2;
  attr_t local_24;
  attr_t colorattr;
  int fill_len;
  int len;
  int i;
  int val_max_local;
  int val_cur_local;
  char *str_local;
  
  sVar2 = strlen(str);
  colorattr = (attr_t)sVar2;
  while ((fill_len = colorattr - 1, -1 < fill_len && (str[fill_len] == ' '))) {
    colorattr = fill_len;
  }
  if ((val_max < 1) || (val_cur < 1)) {
    local_24 = 0;
  }
  else {
    local_24 = (int)(colorattr * val_cur) / val_max;
  }
  if ((int)colorattr < (int)local_24) {
    local_24 = colorattr;
  }
  nh_color = percent_color(val_cur,val_max,'\x01');
  aVar1 = curses_color_attr(nh_color,0);
  waddch(statuswin,0x5b);
  wattr_on(statuswin,aVar1,0);
  wattr_on(statuswin,0x40000,0);
  wprintw(statuswin,"%.*s",local_24,str);
  wattr_off(statuswin,0x40000,0);
  wprintw(statuswin,"%.*s",colorattr - local_24,str + (int)local_24);
  wattr_off(statuswin,aVar1,0);
  waddch(statuswin,0x5d);
  return;
}

Assistant:

static void draw_name_hp_bar(const char *str, int val_cur, int val_max)
{
    int i, len, fill_len;
    attr_t colorattr;

    /* trim spaces to right */
    len = strlen(str);
    for (i = len - 1; i >= 0; i--) {
	if (str[i] == ' ')
	    len = i;
	else
	    break;
    }

    if (val_max <= 0 || val_cur <= 0)
	fill_len = 0;
    else
	fill_len = len * val_cur / val_max;
    if (fill_len > len)
	fill_len = len;

    colorattr = curses_color_attr(percent_color(val_cur, val_max, TRUE), 0);
    waddch(statuswin, '[');
    wattron(statuswin, colorattr);
    /* color the whole string and inverse the bar */
    wattron(statuswin, A_REVERSE);
    wprintw(statuswin, "%.*s", fill_len, str);
    wattroff(statuswin, A_REVERSE);
    wprintw(statuswin, "%.*s", len - fill_len, &str[fill_len]);
    wattroff(statuswin, colorattr);
    waddch(statuswin, ']');
}